

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_SegaPCM_Mem(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  
  pCVar1 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 2] >> 7);
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->writeM8 != (DEVFUNC_WRITE_A16D8)0x0)) {
    (*pCVar1->writeM8)((pCVar1->base).defInf.dataPtr,
                       *(ushort *)(this->_fileData + (ulong)this->_filePos + 1) & 0x7fff,
                       this->_fileData[(ulong)this->_filePos + 3]);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_SegaPCM_Mem(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeM8 == NULL)
		return;
	
	UINT16 memOfs = ReadLE16(&fData[0x01]) & 0x7FFF;
	cDev->writeM8(cDev->base.defInf.dataPtr, memOfs, fData[0x03]);
	return;
}